

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

void __thiscall pugi::xml_document::_create(xml_document *this)

{
  xml_memory_page *result;
  
  if ((this->super_xml_node)._root == (xml_node_struct *)0x0) {
    this->_memory[0x10] = '\0';
    this->_memory[0x11] = '\0';
    this->_memory[0x12] = '\0';
    this->_memory[0x13] = '\0';
    this->_memory[0x14] = '\0';
    this->_memory[0x15] = '\0';
    this->_memory[0x16] = '\0';
    this->_memory[0x17] = '\0';
    this->_memory[0x18] = '\0';
    this->_memory[0x19] = '\0';
    this->_memory[0x1a] = '\0';
    this->_memory[0x1b] = '\0';
    this->_memory[0x1c] = '\0';
    this->_memory[0x1d] = '\0';
    this->_memory[0x1e] = '\0';
    this->_memory[0x1f] = '\0';
    this->_memory[0] = '\0';
    this->_memory[1] = '\0';
    this->_memory[2] = '\0';
    this->_memory[3] = '\0';
    this->_memory[4] = '\0';
    this->_memory[5] = '\0';
    this->_memory[6] = '\0';
    this->_memory[7] = '\0';
    this->_memory[8] = '\0';
    this->_memory[9] = '\0';
    this->_memory[10] = '\0';
    this->_memory[0xb] = '\0';
    this->_memory[0xc] = '\0';
    this->_memory[0xd] = '\0';
    this->_memory[0xe] = '\0';
    this->_memory[0xf] = '\0';
    this->_memory[0x20] = '\0';
    this->_memory[0x21] = '\0';
    this->_memory[0x22] = '\0';
    this->_memory[0x23] = '\0';
    this->_memory[0x24] = '\0';
    this->_memory[0x25] = '\0';
    this->_memory[0x26] = '\0';
    this->_memory[0x27] = '\0';
    this->_memory[0x18] = -0x28;
    this->_memory[0x19] = '\x7f';
    this->_memory[0x1a] = '\0';
    this->_memory[0x1b] = '\0';
    this->_memory[0x1c] = '\0';
    this->_memory[0x1d] = '\0';
    this->_memory[0x1e] = '\0';
    this->_memory[0x1f] = '\0';
    this->_memory[0x50] = '\0';
    this->_memory[0x51] = '\0';
    this->_memory[0x52] = '\0';
    this->_memory[0x53] = '\0';
    this->_memory[0x54] = '\0';
    this->_memory[0x55] = '\0';
    this->_memory[0x56] = '\0';
    this->_memory[0x57] = '\0';
    this->_memory[0x58] = '\0';
    this->_memory[0x59] = '\0';
    this->_memory[0x5a] = '\0';
    this->_memory[0x5b] = '\0';
    this->_memory[0x5c] = '\0';
    this->_memory[0x5d] = '\0';
    this->_memory[0x5e] = '\0';
    this->_memory[0x5f] = '\0';
    this->_memory[0x30] = '\0';
    this->_memory[0x31] = '\0';
    this->_memory[0x32] = '\0';
    this->_memory[0x33] = '\0';
    this->_memory[0x34] = '\0';
    this->_memory[0x35] = '\0';
    this->_memory[0x36] = '\0';
    this->_memory[0x37] = '\0';
    this->_memory[0x38] = '\0';
    this->_memory[0x39] = '\0';
    this->_memory[0x3a] = '\0';
    this->_memory[0x3b] = '\0';
    this->_memory[0x3c] = '\0';
    this->_memory[0x3d] = '\0';
    this->_memory[0x3e] = '\0';
    this->_memory[0x3f] = '\0';
    this->_memory[0x40] = '\0';
    this->_memory[0x41] = '\0';
    this->_memory[0x42] = '\0';
    this->_memory[0x43] = '\0';
    this->_memory[0x44] = '\0';
    this->_memory[0x45] = '\0';
    this->_memory[0x46] = '\0';
    this->_memory[0x47] = '\0';
    this->_memory[0x48] = '\0';
    this->_memory[0x49] = '\0';
    this->_memory[0x4a] = '\0';
    this->_memory[0x4b] = '\0';
    this->_memory[0x4c] = '\0';
    this->_memory[0x4d] = '\0';
    this->_memory[0x4e] = '\0';
    this->_memory[0x4f] = '\0';
    this->_memory[0x60] = '\0';
    this->_memory[0x61] = '\0';
    this->_memory[0x62] = '\0';
    this->_memory[99] = '\0';
    this->_memory[100] = '\0';
    this->_memory[0x65] = '\0';
    this->_memory[0x66] = '\0';
    this->_memory[0x67] = '\0';
    this->_memory[0x28] = '\x01';
    this->_memory[0x29] = '(';
    this->_memory[0x2a] = '\0';
    this->_memory[0x2b] = '\0';
    this->_memory[0x2c] = '\0';
    this->_memory[0x2d] = '\0';
    this->_memory[0x2e] = '\0';
    this->_memory[0x2f] = '\0';
    *(char **)(this->_memory + 0x68) = this->_memory;
    this->_memory[0x70] = -0x28;
    this->_memory[0x71] = '\x7f';
    this->_memory[0x72] = '\0';
    this->_memory[0x73] = '\0';
    this->_memory[0x74] = '\0';
    this->_memory[0x75] = '\0';
    this->_memory[0x76] = '\0';
    this->_memory[0x77] = '\0';
    this->_memory[0x78] = '\0';
    this->_memory[0x79] = '\0';
    this->_memory[0x7a] = '\0';
    this->_memory[0x7b] = '\0';
    this->_memory[0x7c] = '\0';
    this->_memory[0x7d] = '\0';
    this->_memory[0x7e] = '\0';
    this->_memory[0x7f] = '\0';
    this->_memory[0x80] = '\0';
    this->_memory[0x81] = '\0';
    this->_memory[0x82] = '\0';
    this->_memory[0x83] = '\0';
    this->_memory[0x84] = '\0';
    this->_memory[0x85] = '\0';
    this->_memory[0x86] = '\0';
    this->_memory[0x87] = '\0';
    (this->super_xml_node)._root = (xml_node_struct *)(this->_memory + 0x28);
    *(xml_node_struct **)(this->_memory + 0x50) = (xml_node_struct *)(this->_memory + 0x28);
    *(char **)this->_memory = this->_memory + 0x68;
    return;
  }
  __assert_fail("!_root",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/JeffIrwin[P]maph/submodules/colormapper/submodules/pugixml/src/pugixml.cpp"
                ,0x1b35,"void pugi::xml_document::_create()");
}

Assistant:

PUGI__FN void xml_document::_create()
	{
		assert(!_root);

	#ifdef PUGIXML_COMPACT
		// space for page marker for the first page (uint32_t), rounded up to pointer size; assumes pointers are at least 32-bit
		const size_t page_offset = sizeof(void*);
	#else
		const size_t page_offset = 0;
	#endif

		// initialize sentinel page
		PUGI__STATIC_ASSERT(sizeof(impl::xml_memory_page) + sizeof(impl::xml_document_struct) + page_offset <= sizeof(_memory));

		// prepare page structure
		impl::xml_memory_page* page = impl::xml_memory_page::construct(_memory);
		assert(page);

		page->busy_size = impl::xml_memory_page_size;

		// setup first page marker
	#ifdef PUGIXML_COMPACT
		// round-trip through void* to avoid 'cast increases required alignment of target type' warning
		page->compact_page_marker = reinterpret_cast<uint32_t*>(static_cast<void*>(reinterpret_cast<char*>(page) + sizeof(impl::xml_memory_page)));
		*page->compact_page_marker = sizeof(impl::xml_memory_page);
	#endif

		// allocate new root
		_root = new (reinterpret_cast<char*>(page) + sizeof(impl::xml_memory_page) + page_offset) impl::xml_document_struct(page);
		_root->prev_sibling_c = _root;

		// setup sentinel page
		page->allocator = static_cast<impl::xml_document_struct*>(_root);

		// setup hash table pointer in allocator
	#ifdef PUGIXML_COMPACT
		page->allocator->_hash = &static_cast<impl::xml_document_struct*>(_root)->hash;
	#endif

		// verify the document allocation
		assert(reinterpret_cast<char*>(_root) + sizeof(impl::xml_document_struct) <= _memory + sizeof(_memory));
	}